

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

ExprPtr __thiscall pegmatite::range(pegmatite *this,char32_t min,char32_t max)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  Expr *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar3;
  
  __p = (Expr *)operator_new(0x30);
  __p->_vptr_Expr = (_func_int **)&PTR__SetExpr_001580e0;
  __p[1]._vptr_Expr = (_func_int **)0x0;
  *(undefined4 *)&__p[2]._vptr_Expr = 0;
  __p[3]._vptr_Expr = (_func_int **)0x0;
  *(undefined4 *)&__p[4]._vptr_Expr = 0;
  __p[5]._vptr_Expr = (_func_int **)0x0;
  if ((uint)min <= (uint)max) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)(__p + 1),(ulong)(uint)max + 1,false);
    p_Var2 = (((vector<bool,_std::allocator<bool>_> *)(__p + 1))->
             super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
             super__Bit_iterator_base._M_p;
    do {
      puVar1 = p_Var2 + ((uint)min >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)min & 0x3f);
      min = min + L'\x01';
    } while ((uint)min <= (uint)max);
    *(Expr **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<pegmatite::Expr*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    EVar3.super_shared_ptr<pegmatite::Expr>.
    super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    EVar3.super_shared_ptr<pegmatite::Expr>.
    super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ExprPtr)EVar3.super_shared_ptr<pegmatite::Expr>.
                    super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("min <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/CompilerTeaching[P]Pegmatite/parser.cc"
                ,0x1ac,"(anonymous namespace)::SetExpr::SetExpr(char32_t, char32_t)");
}

Assistant:

ExprPtr range(char32_t min, char32_t max)
{
	return ExprPtr(new SetExpr(min, max));
}